

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

bool rcg::setIPV4Address(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,
                        bool exception)

{
  int iVar1;
  element_type *peVar2;
  char *__nptr;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  int *piVar5;
  ulong uVar6;
  invalid_argument *piVar7;
  long *plVar8;
  ulong uVar9;
  string elem;
  stringstream in;
  char *local_1e8;
  undefined8 local_1e0;
  char local_1d8 [16];
  char *local_1c8;
  long *local_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  ios_base local_138 [264];
  
  peVar2 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)&local_1b8,name);
  iVar3 = (*(peVar2->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar2,&local_1b8);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  GenICam_3_4::gcstring::~gcstring((gcstring *)&local_1b8);
  if (plVar4 == (long *)0x0) {
    if (exception) {
      piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_1e8 = local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Feature not found: ","")
      ;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      local_1b8 = (long *)*plVar4;
      plVar8 = plVar4 + 2;
      if (local_1b8 == plVar8) {
        local_1a8 = *plVar8;
        lStack_1a0 = plVar4[3];
        local_1b8 = &local_1a8;
      }
      else {
        local_1a8 = *plVar8;
      }
      local_1b0 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar7,(string *)&local_1b8);
      __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar3 = (*(code *)**(undefined8 **)((long)plVar4 + *(long *)(*plVar4 + -0x28)))
                      ((long)plVar4 + *(long *)(*plVar4 + -0x28));
    if ((iVar3 == 4) || (iVar3 == 2)) {
      plVar4 = (long *)__dynamic_cast(plVar4,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
      if (plVar4 == (long *)0x0) {
        if (!exception) {
          return false;
        }
      }
      else {
        std::__cxx11::string::string((string *)&local_1e8,value,(allocator *)&local_1c8);
        local_1c0 = plVar4;
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&local_1b8,(string *)&local_1e8,_S_out|_S_in);
        if (local_1e8 != local_1d8) {
          operator_delete(local_1e8);
        }
        local_1e0 = 0;
        local_1d8[0] = '\0';
        iVar3 = 4;
        uVar9 = 0;
        local_1e8 = local_1d8;
        while( true ) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_1b8,(string *)&local_1e8,'.');
          __nptr = local_1e8;
          piVar5 = __errno_location();
          iVar1 = *piVar5;
          *piVar5 = 0;
          uVar6 = strtol(__nptr,&local_1c8,10);
          if (local_1c8 == __nptr) break;
          if (((long)(int)uVar6 != uVar6) || (*piVar5 == 0x22)) goto LAB_0011be86;
          if (*piVar5 == 0) {
            *piVar5 = iVar1;
          }
          uVar9 = uVar6 & 0xff | uVar9 << 8;
          iVar3 = iVar3 + -1;
          if (iVar3 == 0) {
            (**(code **)(*local_1c0 + 0x38))(local_1c0,uVar9,1);
            if (local_1e8 != local_1d8) {
              operator_delete(local_1e8);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
            std::ios_base::~ios_base(local_138);
            return true;
          }
        }
        std::__throw_invalid_argument("stoi");
LAB_0011be86:
        std::__throw_out_of_range("stoi");
      }
      piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_1e8 = local_1d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"Feature not integer: ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      local_1b8 = (long *)*plVar4;
      plVar8 = plVar4 + 2;
      if (local_1b8 == plVar8) {
        local_1a8 = *plVar8;
        lStack_1a0 = plVar4[3];
        local_1b8 = &local_1a8;
      }
      else {
        local_1a8 = *plVar8;
      }
      local_1b0 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar7,(string *)&local_1b8);
      __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (exception) {
      piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_1e8 = local_1d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"Feature not writable: ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      local_1b8 = (long *)*plVar4;
      plVar8 = plVar4 + 2;
      if (local_1b8 == plVar8) {
        local_1a8 = *plVar8;
        lStack_1a0 = plVar4[3];
        local_1b8 = &local_1a8;
      }
      else {
        local_1a8 = *plVar8;
      }
      local_1b0 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar7,(string *)&local_1b8);
      __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return false;
}

Assistant:

bool setIPV4Address(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                    const char *value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        GenApi::IInteger *val=dynamic_cast<GenApi::IInteger *>(node);

        if (val != 0)
        {
          int64_t ip=0;

          std::stringstream in(value);
          std::string elem;

          for (int i=0; i<4; i++)
          {
            getline(in, elem, '.');
            ip=(ip<<8)|(stoi(elem)&0xff);
          }

          val->SetValue(ip);
          ret=true;
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not integer: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}